

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_initCStream_advanced
                 (ZSTD_CStream *zcs,void *dict,size_t dictSize,ZSTD_parameters params,
                 unsigned_long_long pss)

{
  ZSTD_compressionParameters cParams;
  ZSTD_parameters ZVar1;
  uint uVar2;
  ZSTD_CStream *code;
  undefined4 in_stack_fffffffffffffee4;
  ZSTD_strategy ZVar3;
  size_t err_code_3;
  ZSTD_compressionParameters local_70;
  ZSTD_CStream *local_50;
  size_t err_code_2;
  size_t err_code_1;
  size_t err_code;
  U64 pledgedSrcSize;
  unsigned_long_long pss_local;
  size_t dictSize_local;
  void *dict_local;
  ZSTD_CStream *zcs_local;
  
  err_code = pss;
  if ((pss == 0) && (params.fParams.contentSizeFlag == 0)) {
    err_code = 0xffffffffffffffff;
  }
  ZVar3 = (ZSTD_strategy)err_code;
  pledgedSrcSize = pss;
  pss_local = dictSize;
  dictSize_local = (size_t)dict;
  dict_local = zcs;
  err_code_1 = ZSTD_CCtx_reset(zcs,ZSTD_reset_session_only);
  uVar2 = ERR_isError(err_code_1);
  if (uVar2 == 0) {
    err_code_2 = ZSTD_CCtx_setPledgedSrcSize((ZSTD_CCtx *)dict_local,err_code);
    uVar2 = ERR_isError(err_code_2);
    ZVar1 = params;
    if (uVar2 == 0) {
      local_70.windowLog = params.cParams.windowLog;
      local_70.chainLog = params.cParams.chainLog;
      params.cParams._8_8_ = ZVar1.cParams._8_8_;
      local_70.hashLog = params.cParams.hashLog;
      local_70.searchLog = params.cParams.searchLog;
      params.cParams._16_8_ = ZVar1.cParams._16_8_;
      local_70.minMatch = params.cParams.minMatch;
      local_70.targetLength = params.cParams.targetLength;
      params.cParams.strategy = ZVar1.cParams.strategy;
      local_70.strategy = params.cParams.strategy;
      params.cParams._8_20_ = ZVar1.cParams._8_20_;
      cParams.targetLength = in_stack_fffffffffffffee4;
      cParams.windowLog = params.cParams.hashLog;
      cParams.chainLog = params.cParams.searchLog;
      cParams.hashLog = params.cParams.minMatch;
      cParams.searchLog = params.cParams.targetLength;
      cParams.minMatch = params.cParams.strategy;
      cParams.strategy = ZVar3;
      params = ZVar1;
      local_50 = (ZSTD_CStream *)ZSTD_checkCParams(cParams);
      uVar2 = ERR_isError((size_t)local_50);
      if (uVar2 == 0) {
        ZSTD_assignParamsToCCtxParams
                  ((ZSTD_CCtx_params *)&err_code_3,(ZSTD_CCtx_params *)((long)dict_local + 0x10),
                   &params);
        memcpy((void *)((long)dict_local + 0x10),&err_code_3,0x90);
        code = (ZSTD_CStream *)
               ZSTD_CCtx_loadDictionary((ZSTD_CCtx *)dict_local,(void *)dictSize_local,pss_local);
        uVar2 = ERR_isError((size_t)code);
        zcs_local = code;
        if (uVar2 == 0) {
          zcs_local = (ZSTD_CStream *)0x0;
        }
      }
      else {
        zcs_local = local_50;
      }
    }
    else {
      zcs_local = (ZSTD_CStream *)err_code_2;
    }
  }
  else {
    zcs_local = (ZSTD_CStream *)err_code_1;
  }
  return (size_t)zcs_local;
}

Assistant:

size_t ZSTD_initCStream_advanced(ZSTD_CStream* zcs,
                                 const void* dict, size_t dictSize,
                                 ZSTD_parameters params, unsigned long long pss)
{
    /* for compatibility with older programs relying on this behavior.
     * Users should now specify ZSTD_CONTENTSIZE_UNKNOWN.
     * This line will be removed in the future.
     */
    U64 const pledgedSrcSize = (pss==0 && params.fParams.contentSizeFlag==0) ? ZSTD_CONTENTSIZE_UNKNOWN : pss;
    DEBUGLOG(4, "ZSTD_initCStream_advanced");
    FORWARD_IF_ERROR( ZSTD_CCtx_reset(zcs, ZSTD_reset_session_only) );
    FORWARD_IF_ERROR( ZSTD_CCtx_setPledgedSrcSize(zcs, pledgedSrcSize) );
    FORWARD_IF_ERROR( ZSTD_checkCParams(params.cParams) );
    zcs->requestedParams = ZSTD_assignParamsToCCtxParams(&zcs->requestedParams, &params);
    FORWARD_IF_ERROR( ZSTD_CCtx_loadDictionary(zcs, dict, dictSize) );
    return 0;
}